

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::WeightParams::SharedDtor(WeightParams *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->float16value_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->rawvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->int8rawvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if ((this != (WeightParams *)&_WeightParams_default_instance_) &&
     (this->quantization_ != (QuantizationParams *)0x0)) {
    (*(this->quantization_->super_MessageLite)._vptr_MessageLite[1])();
    return;
  }
  return;
}

Assistant:

void WeightParams::SharedDtor() {
  float16value_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  rawvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  int8rawvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete quantization_;
  }
}